

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::GridDataType0::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GridDataType0 *this)

{
  bool bVar1;
  ostream *poVar2;
  byte *pbVar3;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1e0;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  GridDataType0 *local_18;
  GridDataType0 *this_local;
  
  local_18 = this;
  this_local = (GridDataType0 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  GridData::GetAsString_abi_cxx11_(&local_1c0,&this->super_GridData);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"GridDataType0:");
  poVar2 = std::operator<<(poVar2,"\n\tNumber Of Bytes: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(ushort *)&(this->super_GridData).field_0xc);
  std::operator<<(poVar2,"\n\tData: ");
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEnd = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->m_vui8DataVals)
  ;
  local_1e0._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          (&this->m_vui8DataVals);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_1e0);
    if (!bVar1) break;
    poVar2 = std::operator<<(local_190," ");
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&citrEnd);
    std::ostream::operator<<(poVar2,(ushort)*pbVar3);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&citrEnd);
  }
  std::operator<<(local_190,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString GridDataType0::GetAsString() const
{
    KStringStream ss;

    ss << GridData::GetAsString()
       << "GridDataType0:"
       << "\n\tNumber Of Bytes: " << m_ui16NumBytes
       << "\n\tData: ";

    vector<KUINT8>::const_iterator citr = m_vui8DataVals.begin();
    vector<KUINT8>::const_iterator citrEnd = m_vui8DataVals.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << " " << ( KUINT16 )*citr;
    }
    ss << "\n";

    return ss.str();
}